

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodeSetPtr pxVar1;
  xmlNs *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr value;
  xmlChar *val;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      iStack_20 = 0xc;
      goto LAB_001b351e;
    }
    pxVar3 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar3);
  }
  if (ctxt->valueNr < 1) {
    iStack_20 = 0x17;
  }
  else {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
       ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
      pxVar3 = xmlXPathValuePop(ctxt);
      pxVar1 = pxVar3->nodesetval;
      if ((((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr == 0)) ||
          (1 < (*pxVar1->nodeTab)->type - XML_ELEMENT_NODE)) ||
         (pxVar2 = (*pxVar1->nodeTab)->ns, pxVar2 == (xmlNs *)0x0)) {
        val = "";
      }
      else {
        val = pxVar2->href;
      }
      value = xmlXPathCacheNewString(ctxt,val);
      xmlXPathValuePush(ctxt,value);
      xmlXPathReleaseObject(ctxt->context,pxVar3);
      return;
    }
    iStack_20 = 0xb;
  }
LAB_001b351e:
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }
    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	    if (cur->nodesetval->nodeTab[i]->ns == NULL)
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			  cur->nodesetval->nodeTab[i]->ns->href));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}